

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_init_mirostat_v2(uint32_t seed,float tau,float eta)

{
  uint32_t uVar1;
  undefined4 *ctx;
  llama_sampler *plVar2;
  undefined4 in_EDI;
  float in_XMM0_Da;
  undefined4 in_XMM1_Da;
  uint32_t seed_cur;
  uint32_t in_stack_00002710;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffffe0;
  
  uVar1 = get_rng_seed(in_stack_00002710);
  ctx = (undefined4 *)operator_new(0x13a0);
  *ctx = in_EDI;
  ctx[1] = uVar1;
  ctx[2] = in_XMM0_Da;
  ctx[3] = in_XMM1_Da;
  ctx[4] = in_XMM0_Da + in_XMM0_Da;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffffe0,(result_type)ctx);
  plVar2 = llama_sampler_init((llama_sampler_i *)in_stack_ffffffffffffffe0,ctx);
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_mirostat_v2(uint32_t seed, float tau, float eta) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_mirostat_v2_i,
        /* .ctx   = */ new llama_sampler_mirostat_v2 {
            /* .seed     = */ seed,
            /* .seed_cur = */ seed_cur,
            /* .tau      = */ tau,
            /* .eta      = */ eta,
            /* .mu       = */ 2.0f*tau,
            /* .rng      = */ std::mt19937(seed_cur),
        }
    );
}